

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O1

int __thiscall CPoint::IsPin(CPoint *this)

{
  CObject *pCVar1;
  CNet *this_00;
  int iVar2;
  int iVar3;
  CPin *pCVar4;
  bool bVar5;
  
  pCVar1 = (this->super_CObject).m_pParent;
  if (pCVar1 == (CObject *)0x0) {
    __assert_fail("GetParent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Point.cpp"
                  ,0xf9,"int CPoint::IsPin()");
  }
  this_00 = (CNet *)pCVar1->m_pParent;
  if (this_00 == (CNet *)0x0) {
    __assert_fail("pNet",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Point.cpp"
                  ,0xfb,"int CPoint::IsPin()");
  }
  iVar2 = CNet::GetNumPin(this_00);
  bVar5 = 0 < iVar2;
  if (0 < iVar2) {
    pCVar4 = CNet::GetPin(this_00,0);
    if ((this->m_iX != (pCVar4->super_CPoint).m_iX) || (this->m_iY != (pCVar4->super_CPoint).m_iY))
    {
      iVar2 = 1;
      do {
        iVar3 = CNet::GetNumPin(this_00);
        bVar5 = iVar2 < iVar3;
        if (iVar3 <= iVar2) break;
        pCVar4 = CNet::GetPin(this_00,iVar2);
        iVar2 = iVar2 + 1;
      } while ((this->m_iX != (pCVar4->super_CPoint).m_iX) ||
              (this->m_iY != (pCVar4->super_CPoint).m_iY));
    }
  }
  return (int)bVar5;
}

Assistant:

CWire* CPoint::GetParent()
{
	return	(CWire*)m_pParent;
}